

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_arena.h
# Opt level: O1

void * __thiscall
google::protobuf::internal::SerialArena::
AllocateAligned<(google::protobuf::internal::AllocationClient)0>(SerialArena *this,size_t n)

{
  bool bVar1;
  Nonnull<const_char_*> pcVar2;
  SerialArena *v2;
  SerialArena *this_00;
  SerialArena *unaff_R14;
  void *ptr;
  atomic<char_*> local_20;
  
  if ((n & 7) == 0) {
    v2 = (SerialArena *)(this->ptr_)._M_b._M_p;
    this_00 = (SerialArena *)this->limit_;
    unaff_R14 = this;
    if (v2 <= this_00) {
      pcVar2 = (Nonnull<const_char_*>)0x0;
      goto LAB_001418f2;
    }
  }
  else {
    this_00 = (SerialArena *)&stack0xffffffffffffffe0;
    v2 = (SerialArena *)n;
    AllocateAligned<(google::protobuf::internal::AllocationClient)0>(this_00);
  }
  pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<char_const*,char_const*>
                     ((char *)this_00,(char *)v2,"limit_ >= ptr()");
LAB_001418f2:
  if (pcVar2 != (Nonnull<const_char_*>)0x0) {
    AllocateAligned<(google::protobuf::internal::AllocationClient)0>();
  }
  bVar1 = MaybeAllocateAligned(unaff_R14,n,(void **)&stack0xffffffffffffffe0);
  if (!bVar1) {
    local_20._M_b._M_p = (__base_type)AllocateAlignedFallback(unaff_R14,n);
  }
  return (void *)local_20._M_b._M_p;
}

Assistant:

void* AllocateAligned(size_t n) {
    ABSL_DCHECK(internal::ArenaAlignDefault::IsAligned(n));
    ABSL_DCHECK_GE(limit_, ptr());

    if (alloc_client == AllocationClient::kArray) {
      if (void* res = TryAllocateFromCachedBlock(n)) {
        return res;
      }
    }

    void* ptr;
    if (ABSL_PREDICT_TRUE(MaybeAllocateAligned(n, &ptr))) {
      return ptr;
    }
    return AllocateAlignedFallback(n);
  }